

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::WriteTargetClean(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Rb_tree_header *p_Var1;
  size_t __n;
  string *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Rb_tree_node_base *p_Var7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  string *psVar8;
  mapped_type *pmVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fileConfig;
  string *config_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *psVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  pointer pbVar12;
  pointer pbVar13;
  string_view separator;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmNinjaRule rule;
  string local_2a8;
  char local_281;
  string local_280;
  undefined1 local_260 [32];
  undefined8 local_240;
  char *local_238;
  allocator<char> local_229;
  undefined1 local_228 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  ostream *local_1e8;
  undefined1 local_1e0 [32];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  pointer local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  undefined1 local_158 [24];
  _Alloc_hider local_140;
  pointer local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  _Alloc_hider local_120;
  pointer local_118;
  undefined1 local_110 [16];
  _Alloc_hider local_100;
  _Base_ptr local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  bool local_c0;
  string *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  char *local_50;
  size_type local_48;
  char local_40;
  uint7 uStack_3f;
  undefined8 uStack_38;
  
  local_1e8 = os;
  local_281 = WriteTargetCleanAdditional(this,os);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CLEAN","");
  local_1e0._0_8_ = local_1e0 + 0x10;
  if (local_50 == &local_40) {
    local_1e0._24_8_ = uStack_38;
  }
  else {
    local_1e0._0_8_ = local_50;
  }
  local_1e0._16_8_ = (ulong)uStack_3f << 8;
  local_1e0._8_8_ = local_48;
  local_48 = 0;
  local_40 = '\0';
  local_1b8 = 0;
  local_1b0._M_allocated_capacity = local_1b0._M_allocated_capacity & 0xffffffffffffff00;
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_1a0._8_8_ = (pointer)0x0;
  local_190._M_local_buf[0] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = (pointer)0x0;
  local_170._M_local_buf[0] = '\0';
  local_160._M_p = local_158 + 8;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = local_158._8_8_ & 0xffffffffffffff00;
  local_140._M_p = (pointer)&local_130;
  local_138 = (pointer)0x0;
  local_130._M_local_buf[0] = '\0';
  local_120._M_p = local_110;
  local_118 = (pointer)0x0;
  local_110[0] = '\0';
  local_100._M_p = (pointer)&local_f0;
  local_f8 = (_Base_ptr)0x0;
  local_f0._M_allocated_capacity = local_f0._M_allocated_capacity & 0xffffffffffffff00;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_c0 = false;
  local_1c0._M_p = (pointer)&local_1b0;
  local_e0._M_p = (pointer)&local_d0;
  local_50 = &local_40;
  NinjaCmd_abi_cxx11_(&local_280,this);
  local_260._0_8_ = local_280._M_string_length;
  local_260._8_8_ = local_280._M_dataplus._M_p;
  local_260._16_8_ = (char *)0x1c;
  local_260._24_8_ = " $FILE_ARG -t clean $TARGETS";
  views._M_len = 2;
  views._M_array = (iterator)local_260;
  cmCatViews_abi_cxx11_(&local_2a8,views);
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_1a0,0,(char *)local_1a0._8_8_,0x6d50fb);
  std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)local_178,0x6d5117);
  WriteRule((ostream *)
            (this->RulesFileStream)._M_t.
            super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
            .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
            (cmNinjaRule *)local_1e0);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_1e0);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            (&local_200,
             (cmMakefile *)
             (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CLEAN","");
  local_1e0._0_8_ = local_1e0 + 0x10;
  local_1e0._8_8_ = (char *)0x0;
  local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
  if (local_70 == &local_60) {
    local_1b0._8_8_ = local_60._8_8_;
    local_1c0._M_p = (pointer)&local_1b0;
  }
  else {
    local_1c0._M_p = (pointer)local_70;
  }
  local_1b8 = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_110._8_4_ = 0;
  local_100._M_p = (pointer)0x0;
  local_70 = &local_60;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1a0,0,0x90);
  local_f0._8_8_ = 0;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_f8 = (_Base_ptr)(local_110 + 8);
  local_f0._M_allocated_capacity = (size_type)(_Base_ptr)(local_110 + 8);
  local_e0._M_p = (pointer)&local_d0;
  std::__cxx11::string::_M_replace((ulong)local_1e0,0,(char *)local_1e0._8_8_,0x6d513a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
  local_b8 = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar8 = local_200.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_200.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x23])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,(char *)CONCAT44(extraout_var,iVar5),
                 (allocator<char> *)local_228);
      NinjaOutputPath(&local_2a8,this,&local_280);
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                ((string *)local_260,this,&local_2a8);
      std::__cxx11::string::operator=((string *)local_1a0._0_8_,(string *)local_260);
      if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
        operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x26])(this);
      if ((char)iVar5 != '\0') {
        local_228._0_8_ = local_228 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"CMakeFiles/cmake_byproducts_for_clean_target","");
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])(&local_280,this,(allocator<char> *)local_228,psVar8);
        local_260._0_8_ = local_280._M_string_length;
        local_260._8_8_ = local_280._M_dataplus._M_p;
        local_260._16_8_ = &DAT_00000001;
        local_260._24_8_ = (long)"\'\nfailed with:\n " + 0xf;
        local_240 = 0x2c;
        local_238 = "CMakeFiles/cmake_byproducts_for_clean_target";
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_260;
        cmCatViews_abi_cxx11_(&local_2a8,views_00);
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"TARGETS","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_110,(key_type *)local_260);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2a8);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_228._16_8_)->_M_p + 1));
        }
      }
      uVar4 = local_158._8_8_;
      uVar3 = local_158._0_8_;
      if (local_158._8_8_ != local_158._0_8_) {
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_158._0_8_ + 0x10);
        do {
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)(paVar10->_M_local_buf + -0x10)) {
            operator_delete(*(long **)(paVar10->_M_local_buf + -0x10),
                            paVar10->_M_allocated_capacity + 1);
          }
          psVar11 = (string *)(paVar10->_M_local_buf + 0x10);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar10->_M_local_buf + 0x20);
        } while (psVar11 != (string *)uVar4);
        local_158._8_8_ = uVar3;
      }
      config_00 = local_200.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_281 != '\0') {
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_280,"CMakeFiles/clean.additional","");
        NinjaOutputPath(&local_2a8,this,&local_280);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                  this,&local_2a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        config_00 = local_200.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = local_200.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          config_00 = local_200.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          psVar2 = local_200.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; config_00 != psVar2; config_00 = config_00 + 1) {
        __n = config_00->_M_string_length;
        if (((__n == psVar8->_M_string_length) &&
            ((__n == 0 ||
             (iVar5 = bcmp((config_00->_M_dataplus)._M_p,(psVar8->_M_dataplus)._M_p,__n), iVar5 == 0
             )))) || ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x26])(this);
          if ((char)iVar5 != '\0') {
            cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(&local_280,config_00);
            local_260._0_8_ = (pointer)0x3;
            local_260._8_8_ = "-f ";
            local_260._16_8_ = local_280._M_string_length;
            local_260._24_8_ = local_280._M_dataplus._M_p;
            views_01._M_len = 2;
            views_01._M_array = (iterator)local_260;
            cmCatViews_abi_cxx11_(&local_2a8,views_01);
            local_260._0_8_ = local_260 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"FILE_ARG","");
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_110,(key_type *)local_260);
            std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2a8);
            if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
              operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1
                             );
            }
          }
          iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x41])(this,config_00);
          WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar5),(cmNinjaBuild *)local_1e0,0,
                     (bool *)0x0);
        }
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != local_b8);
  }
  if ((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x23])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,(char *)CONCAT44(extraout_var_01,iVar5),&local_229);
    NinjaOutputPath(&local_2a8,this,&local_280);
    local_228._0_8_ = (pointer)(local_228 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"all","");
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
              (local_260,this,&local_2a8,local_228);
    std::__cxx11::string::operator=((string *)local_1a0._0_8_,(string *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    }
    if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_228._16_8_)->_M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    uVar4 = local_158._8_8_;
    uVar3 = local_158._0_8_;
    if (local_158._8_8_ != local_158._0_8_) {
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_158._0_8_ + 0x10);
      do {
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*(long **)(paVar10->_M_local_buf + -0x10)) {
          operator_delete(*(long **)(paVar10->_M_local_buf + -0x10),
                          paVar10->_M_allocated_capacity + 1);
        }
        psVar11 = (string *)(paVar10->_M_local_buf + 0x10);
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar10->_M_local_buf + 0x20);
      } while (psVar11 != (string *)uVar4);
      local_158._8_8_ = uVar3;
    }
    if (local_281 != '\0') {
      p_Var7 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        do {
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"CMakeFiles/clean.additional","");
          NinjaOutputPath(&local_2a8,this,&local_280);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                    this,&local_2a8,p_Var7 + 1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
          ;
          if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      }
    }
    local_228._0_8_ = (pointer)0x0;
    local_228._8_8_ = (pointer)0x0;
    local_228._16_8_ = (pointer)0x0;
    p_Var7 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var1) {
      do {
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"CMakeFiles/cmake_byproducts_for_clean_target","");
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                  this,&local_2a8,p_Var7 + 1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    }
    local_260._0_8_ = "CMakeFiles/cmake_byproducts_for_clean_target";
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_228,
               (char **)local_260);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin((string *)local_260,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_228,separator,(string_view)ZEXT816(0));
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"TARGETS","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_110,&local_2a8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    }
    pbVar13 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(&local_280,pbVar12);
        local_260._0_8_ = (pointer)0x3;
        local_260._8_8_ = "-f ";
        local_260._16_8_ = local_280._M_string_length;
        local_260._24_8_ = local_280._M_dataplus._M_p;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_260;
        cmCatViews_abi_cxx11_(&local_2a8,views_02);
        local_260._0_8_ = local_260 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"FILE_ARG","");
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_110,(key_type *)local_260);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_2a8);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x41])(this,pbVar12);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_02,iVar5),(cmNinjaBuild *)local_1e0,0,
                   (bool *)0x0);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar13);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  }
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1e0);
  iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(this);
  if ((char)iVar5 != '\0') {
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"phony","");
    local_1e0._0_8_ = local_1e0 + 0x10;
    local_1e0._8_8_ = (char *)0x0;
    local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
    if (local_90 == &local_80) {
      local_1b0._8_8_ = local_80._8_8_;
      local_1c0._M_p = (pointer)&local_1b0;
    }
    else {
      local_1c0._M_p = (pointer)local_90;
    }
    local_1b8 = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_110._8_4_ = 0;
    local_100._M_p = (pointer)0x0;
    local_90 = &local_80;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,0,0x90);
    local_f8 = (_Base_ptr)(local_110 + 8);
    local_f0._8_8_ = 0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_f0._M_allocated_capacity = (size_type)local_f8;
    local_e0._M_p = (pointer)&local_d0;
    iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x23])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,(char *)CONCAT44(extraout_var_03,iVar5),
               (allocator<char> *)&local_280);
    NinjaOutputPath((string *)local_260,this,&local_2a8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_158);
    pbVar13 = local_200.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x23])(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,(char *)CONCAT44(extraout_var_04,iVar5),
                   (allocator<char> *)local_228);
        NinjaOutputPath(&local_2a8,this,&local_280);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])((string *)local_260,this,&local_2a8);
        std::__cxx11::string::operator=((string *)local_158._0_8_,(string *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                  _vptr_cmGlobalGenerator[0x42])(this,pbVar12);
        WriteBuild(this,(ostream *)CONCAT44(extraout_var_05,iVar5),(cmNinjaBuild *)local_1e0,0,
                   (bool *)0x0);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 != pbVar13);
    }
    uVar4 = local_158._8_8_;
    uVar3 = local_158._0_8_;
    if ((this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (local_158._8_8_ != local_158._0_8_) {
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_158._0_8_ + 0x10);
        do {
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(long **)(paVar10->_M_local_buf + -0x10)) {
            operator_delete(*(long **)(paVar10->_M_local_buf + -0x10),
                            paVar10->_M_allocated_capacity + 1);
          }
          psVar11 = (string *)(paVar10->_M_local_buf + 0x10);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar10->_M_local_buf + 0x20);
        } while (psVar11 != (string *)uVar4);
        local_158._8_8_ = uVar3;
      }
      p_Var7 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var7 != p_Var1) {
        do {
          iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x23])(this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,(char *)CONCAT44(extraout_var_06,iVar5),
                     (allocator<char> *)local_228);
          NinjaOutputPath(&local_2a8,this,&local_280);
          (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x48])((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                    this,&local_2a8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
          ;
          if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
            operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
        } while ((_Rb_tree_header *)p_Var7 != p_Var1);
      }
      iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[0x43])(this);
      WriteBuild(this,(ostream *)CONCAT44(extraout_var_07,iVar5),(cmNinjaBuild *)local_1e0,0,
                 (bool *)0x0);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1e0);
  }
  iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(this);
  if ((char)iVar5 != '\0') {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"phony","");
    local_1e0._0_8_ = local_1e0 + 0x10;
    local_1e0._8_8_ = (char *)0x0;
    local_1e0._16_8_ = local_1e0._16_8_ & 0xffffffffffffff00;
    if (local_b0 == &local_a0) {
      local_1b0._8_8_ = local_a0._8_8_;
      local_1c0._M_p = (pointer)&local_1b0;
    }
    else {
      local_1c0._M_p = (pointer)local_b0;
    }
    local_1b8 = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_110._8_4_ = 0;
    local_100._M_p = (pointer)0x0;
    local_b0 = &local_a0;
    memset((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,0,0x90);
    local_f8 = (_Base_ptr)(local_110 + 8);
    local_f0._8_8_ = 0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_f0._M_allocated_capacity = (size_type)local_f8;
    local_e0._M_p = (pointer)&local_d0;
    std::__cxx11::string::_M_replace((ulong)local_1e0,0,(char *)local_1e0._8_8_,0x6d515e);
    local_260._0_8_ = local_260 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_260,"CMakeFiles/cmake_byproducts_for_clean_target","");
    psVar8 = ConvertToNinjaPath(this,(string *)local_260);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,psVar8
              );
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158,&this->ByproductsForCleanTarget);
    WriteBuild(this,local_1e8,(cmNinjaBuild *)local_1e0,0,(bool *)0x0);
    if (local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar13 = local_200.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"CMakeFiles/cmake_byproducts_for_clean_target","");
        psVar8 = ConvertToNinjaPath(this,&local_2a8);
        (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
          [0x48])((string *)local_260,this,psVar8);
        std::__cxx11::string::operator=((string *)local_1a0._0_8_,(string *)local_260);
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,(ulong)(local_260._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                 ::operator[](&this->Configs,pbVar13);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_158,&pmVar9->ByproductsForCleanTarget);
        WriteBuild(this,local_1e8,(cmNinjaBuild *)local_1e0,0,(bool *)0x0);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 !=
               local_200.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_1e0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetClean(std::ostream& os)
{
  // -- Additional clean target
  bool additionalFiles = this->WriteTargetCleanAdditional(os);

  // -- Default clean target
  // Write rule
  {
    cmNinjaRule rule("CLEAN");
    rule.Command = cmStrCat(this->NinjaCmd(), " $FILE_ARG -t clean $TARGETS");
    rule.Description = "Cleaning all built files...";
    rule.Comment = "Rule for cleaning all built files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  auto const configs = this->Makefiles.front()->GetGeneratorConfigs(
    cmMakefile::IncludeEmptyConfig);

  // Write build
  {
    cmNinjaBuild build("CLEAN");
    build.Comment = "Clean all the built files.";
    build.Outputs.emplace_back();

    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), config);
      if (this->IsMultiConfig()) {
        build.Variables["TARGETS"] =
          cmStrCat(this->BuildAlias(GetByproductsForCleanTargetName(), config),
                   " ", GetByproductsForCleanTargetName());
      }
      build.ExplicitDeps.clear();
      if (additionalFiles) {
        build.ExplicitDeps.push_back(this->BuildAlias(
          this->NinjaOutputPath(this->GetAdditionalCleanTargetName()),
          config));
      }
      for (auto const& fileConfig : configs) {
        if (fileConfig != config && !this->EnableCrossConfigBuild()) {
          continue;
        }
        if (this->IsMultiConfig()) {
          build.Variables["FILE_ARG"] = cmStrCat(
            "-f ",
            cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(fileConfig));
        }
        this->WriteBuild(*this->GetImplFileStream(fileConfig), build);
      }
    }

    if (this->EnableCrossConfigBuild()) {
      build.Outputs.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), "all");
      build.ExplicitDeps.clear();

      if (additionalFiles) {
        for (auto const& config : this->CrossConfigs) {
          build.ExplicitDeps.push_back(this->BuildAlias(
            this->NinjaOutputPath(this->GetAdditionalCleanTargetName()),
            config));
        }
      }

      std::vector<std::string> byproducts;
      for (auto const& config : this->CrossConfigs) {
        byproducts.push_back(
          this->BuildAlias(GetByproductsForCleanTargetName(), config));
      }
      byproducts.emplace_back(GetByproductsForCleanTargetName());
      build.Variables["TARGETS"] = cmJoin(byproducts, " ");

      for (auto const& fileConfig : configs) {
        build.Variables["FILE_ARG"] = cmStrCat(
          "-f ",
          cmGlobalNinjaMultiGenerator::GetNinjaImplFilename(fileConfig));
        this->WriteBuild(*this->GetImplFileStream(fileConfig), build);
      }
    }
  }

  if (this->IsMultiConfig()) {
    cmNinjaBuild build("phony");
    build.Outputs.emplace_back(
      this->NinjaOutputPath(this->GetCleanTargetName()));
    build.ExplicitDeps.emplace_back();

    for (auto const& config : configs) {
      build.ExplicitDeps.front() = this->BuildAlias(
        this->NinjaOutputPath(this->GetCleanTargetName()), config);
      this->WriteBuild(*this->GetConfigFileStream(config), build);
    }

    if (!this->DefaultConfigs.empty()) {
      build.ExplicitDeps.clear();
      for (auto const& config : this->DefaultConfigs) {
        build.ExplicitDeps.push_back(this->BuildAlias(
          this->NinjaOutputPath(this->GetCleanTargetName()), config));
      }
      this->WriteBuild(*this->GetDefaultFileStream(), build);
    }
  }

  // Write byproducts
  if (this->IsMultiConfig()) {
    cmNinjaBuild build("phony");
    build.Comment = "Clean byproducts.";
    build.Outputs.emplace_back(
      this->ConvertToNinjaPath(GetByproductsForCleanTargetName()));
    build.ExplicitDeps = this->ByproductsForCleanTarget;
    this->WriteBuild(os, build);

    for (auto const& config : configs) {
      build.Outputs.front() = this->BuildAlias(
        this->ConvertToNinjaPath(GetByproductsForCleanTargetName()), config);
      build.ExplicitDeps = this->Configs[config].ByproductsForCleanTarget;
      this->WriteBuild(os, build);
    }
  }
}